

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop_time.c
# Opt level: O3

void read_stop_time(stop_time_t *record,int field_count,char **field_names,char **field_values)

{
  char cVar1;
  double dVar2;
  int iVar3;
  stop_type_t sVar4;
  timepoint_precision_t tVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  stop_time_t *__dest;
  
  record->trip_id[0] = '\0';
  record->arrival_time[0] = '\0';
  record->departure_time[0] = '\0';
  record->stop_id[0] = '\0';
  record->stop_sequence = 0;
  record->stop_headsign[0] = '\0';
  record->pickup_type = ST_REGULAR;
  record->dropoff_type = ST_REGULAR;
  record->shape_dist_traveled = 0.0;
  record->timepoint = TP_EXACT;
  if (0 < field_count) {
    uVar7 = 0;
    do {
      pcVar8 = field_names[uVar7];
      iVar3 = strcmp(pcVar8,"trip_id");
      if (iVar3 == 0) {
        pcVar8 = field_values[uVar7];
        __dest = record;
LAB_0010614d:
        strcpy(__dest->trip_id,pcVar8);
      }
      else {
        iVar3 = strcmp(pcVar8,"arrival_time");
        if (iVar3 == 0) {
          pcVar8 = field_values[uVar7];
          __dest = (stop_time_t *)record->arrival_time;
          goto LAB_0010614d;
        }
        iVar3 = strcmp(pcVar8,"departure_time");
        if (iVar3 == 0) {
          pcVar8 = field_values[uVar7];
          __dest = (stop_time_t *)record->departure_time;
          goto LAB_0010614d;
        }
        iVar3 = strcmp(pcVar8,"stop_id");
        if (iVar3 == 0) {
          pcVar8 = field_values[uVar7];
          __dest = (stop_time_t *)record->stop_id;
          goto LAB_0010614d;
        }
        iVar3 = strcmp(pcVar8,"stop_sequence");
        if (iVar3 == 0) {
          uVar6 = strtoul(field_values[uVar7],(char **)0x0,0);
          record->stop_sequence = (uint)uVar6;
        }
        else {
          iVar3 = strcmp(pcVar8,"stop_headsign");
          if (iVar3 == 0) {
            pcVar8 = field_values[uVar7];
            __dest = (stop_time_t *)record->stop_headsign;
            goto LAB_0010614d;
          }
          iVar3 = strcmp(pcVar8,"pickup_type");
          if (iVar3 == 0) {
            sVar4 = parse_stop_type(field_values[uVar7]);
            record->pickup_type = sVar4;
          }
          else {
            iVar3 = strcmp(pcVar8,"drop_off_type");
            if (iVar3 == 0) {
              sVar4 = parse_stop_type(field_values[uVar7]);
              record->dropoff_type = sVar4;
            }
            else {
              iVar3 = strcmp(pcVar8,"shape_dist_traveled");
              if (iVar3 == 0) {
                dVar2 = strtod(field_values[uVar7],(char **)0x0);
                record->shape_dist_traveled = dVar2;
              }
              else {
                iVar3 = strcmp(pcVar8,"timepoint");
                if (iVar3 == 0) {
                  pcVar8 = field_values[uVar7];
                  cVar1 = *pcVar8;
                  if (cVar1 == '1') {
                    if (pcVar8[1] != '\0') goto LAB_0010619f;
                    tVar5 = TP_EXACT;
                  }
                  else if ((cVar1 == '0') && (pcVar8[1] == '\0')) {
                    tVar5 = TP_APPROXIMATE;
                  }
                  else {
LAB_0010619f:
                    tVar5 = TP_NOT_SET - (cVar1 == '\0');
                  }
                  record->timepoint = tVar5;
                }
              }
            }
          }
        }
      }
      uVar7 = uVar7 + 1;
    } while ((uint)field_count != uVar7);
  }
  return;
}

Assistant:

void read_stop_time(stop_time_t *record, int field_count, const char **field_names, const char **field_values) {
    init_stop_time(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "trip_id") == 0) {
            strcpy(record->trip_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "arrival_time") == 0) {
            strcpy(record->arrival_time, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "departure_time") == 0) {
            strcpy(record->departure_time, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "stop_id") == 0) {
            strcpy(record->stop_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "stop_sequence") == 0) {
            record->stop_sequence = (unsigned int)strtoul(field_values[i], NULL, 0);
            continue;
        }
        if (strcmp(field_names[i], "stop_headsign") == 0) {
            strcpy(record->stop_headsign, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "pickup_type") == 0) {
            record->pickup_type = parse_stop_type(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "drop_off_type") == 0) {
            record->dropoff_type = parse_stop_type(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "shape_dist_traveled") == 0) {
            record->shape_dist_traveled = strtod(field_values[i], NULL);
            continue;
        }
        if (strcmp(field_names[i], "timepoint") == 0) {
            record->timepoint = parse_timepoint_precision(field_values[i]);
            continue;
        }
    }
}